

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall libtorrent::aux::socks5::on_connected(socks5 *this,error_code *e)

{
  bool bVar1;
  char *pcVar2;
  char cVar3;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_50;
  mutable_buffer local_30;
  
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::cancel(&this->m_timer);
  local_50._0_16_ = boost::asio::error::make_error_code(operation_aborted);
  bVar1 = boost::system::operator==(e,(error_code *)&local_50);
  if ((!bVar1) && (this->m_abort == false)) {
    if (e->failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_50._M_f._0_1_ = 0x10;
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_50,e);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else {
      local_30.data_ = &this->m_tmp_buf;
      (this->m_tmp_buf)._M_elems[0] = '\x05';
      pcVar2 = (this->m_tmp_buf)._M_elems + 3;
      cVar3 = '\x01';
      if (((this->m_proxy_settings).username._M_string_length != 0) &&
         ((this->m_proxy_settings).type != socks5)) {
        (this->m_tmp_buf)._M_elems[3] = '\x02';
        pcVar2 = (this->m_tmp_buf)._M_elems + 4;
        cVar3 = '\x02';
      }
      (this->m_tmp_buf)._M_elems[1] = cVar3;
      (this->m_tmp_buf)._M_elems[2] = '\0';
      local_30.size_ = (long)pcVar2 - (long)local_30.data_;
      ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::socks5,void>
                ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_50._0_16_ = ZEXT816(0x328b98);
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_Stack_60[0]._M_pi;
      local_68 = (element_type *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::asio::
      async_write<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::mutable_buffer,std::_Bind<void(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&this->m_socks5_sock,&local_30,&local_50,(type *)0x0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_50 + 0x18));
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
    }
  }
  return;
}

Assistant:

void socks5::on_connected(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_connected");

	m_timer.cancel();

	if (e == boost::asio::error::operation_aborted) return;

	if (m_abort) return;

	// we failed to connect to the proxy
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::connect, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	// send SOCKS5 authentication methods
	char* p = m_tmp_buf.data();
	write_uint8(5, p); // SOCKS VERSION 5
	if (m_proxy_settings.username.empty()
		|| m_proxy_settings.type == settings_pack::socks5)
	{
		write_uint8(1, p); // 1 authentication method (no auth)
		write_uint8(0, p); // no authentication
	}
	else
	{
		write_uint8(2, p); // 2 authentication methods
		write_uint8(0, p); // no authentication
		write_uint8(2, p); // username/password
	}
	TORRENT_ASSERT_VAL(p - m_tmp_buf.data() < int(m_tmp_buf.size()), (p - m_tmp_buf.data()));
	ADD_OUTSTANDING_ASYNC("socks5::on_handshake1");
	boost::asio::async_write(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data()
		, aux::numeric_cast<std::size_t>(p - m_tmp_buf.data()))
		, std::bind(&socks5::handshake1, self(), _1));
}